

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,char *filename,bool compact)

{
  FILE *__stream;
  FILE *fp;
  bool compact_local;
  char *filename_local;
  XMLDocument *this_local;
  
  __stream = (FILE *)callfopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    SetError(this,XML_ERROR_FILE_COULD_NOT_BE_OPENED,filename,(char *)0x0,0);
    this_local._4_4_ = this->_errorID;
  }
  else {
    SaveFile(this,(FILE *)__stream,compact);
    fclose(__stream);
    this_local._4_4_ = this->_errorID;
  }
  return this_local._4_4_;
}

Assistant:

XMLError XMLDocument::SaveFile( const char* filename, bool compact )
{
    FILE* fp = callfopen( filename, "w" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_COULD_NOT_BE_OPENED, filename, 0, 0 );
        return _errorID;
    }
    SaveFile(fp, compact);
    fclose( fp );
    return _errorID;
}